

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

int32 ps_lattice_posterior(ps_lattice_t *dag,ngram_model_t *lmset,float32 ascale)

{
  s3wid_t w;
  logmath_t *lmath;
  ps_search_t *ppVar1;
  int iVar2;
  int logb_x;
  int32 iVar3;
  ps_latlink_t *ppVar4;
  uint uVar5;
  latlink_list_t *plVar6;
  ps_latlink_s *ppVar7;
  ps_latlink_s *ppVar8;
  ngram_model_t *model;
  ps_latnode_t *ppVar9;
  bool bVar10;
  bool bVar11;
  int32 from_wid;
  int32 n_used;
  s3wid_t local_4c;
  ps_latlink_t *local_48;
  int local_40;
  int32 local_3c;
  ngram_model_t *local_38;
  
  lmath = dag->lmath;
  local_38 = lmset;
  for (ppVar9 = dag->nodes; ppVar9 != (ps_latnode_t *)0x0; ppVar9 = ppVar9->next) {
    for (plVar6 = ppVar9->exits; plVar6 != (latlink_list_t *)0x0; plVar6 = plVar6->next) {
      iVar2 = logmath_get_zero(lmath);
      plVar6->link->beta = iVar2;
    }
  }
  ppVar7 = (ps_latlink_t *)0x0;
  ppVar4 = ps_lattice_reverse_edges(dag,(ps_latnode_t *)0x0,(ps_latnode_t *)0x0);
  if (ppVar4 != (ps_latlink_t *)0x0) {
    local_40 = -0x80000000;
    ppVar7 = (ps_latlink_t *)0x0;
    do {
      local_4c = ppVar4->from->basewid;
      w = ppVar4->to->basewid;
      iVar2 = dict_filler_word(dag->dict,local_4c);
      if (iVar2 == 0) {
        bVar10 = false;
      }
      else {
        bVar10 = ppVar4->from != dag->start;
      }
      local_48 = ppVar7;
      iVar2 = dict_filler_word(dag->dict,w);
      if (iVar2 == 0) {
        bVar11 = false;
      }
      else {
        bVar11 = ppVar4->to != dag->end;
      }
      if ((!bVar11) && (ppVar7 = ppVar4, bVar10)) {
        do {
          ppVar7 = ppVar7->best_prev;
          if (ppVar7 == (ps_latlink_s *)0x0) {
            bVar10 = true;
            goto LAB_00112f3f;
          }
          local_4c = ppVar7->from->basewid;
          iVar2 = dict_filler_word(dag->dict,local_4c);
          if (iVar2 == 0) {
            bVar10 = false;
            goto LAB_00112f3f;
          }
        } while (ppVar7->from != dag->start);
        bVar10 = false;
      }
LAB_00112f3f:
      ppVar7 = local_48;
      iVar2 = 0;
      if ((local_38 != (ngram_model_t *)0x0) && (iVar2 = 0, !bVar10 && !bVar11)) {
        iVar2 = ngram_ng_prob(local_38,w,&local_4c,1,&local_3c);
      }
      if (ppVar4->to == dag->end) {
        if (local_40 < ppVar4->path_scr) {
          local_40 = ppVar4->path_scr;
          ppVar7 = ppVar4;
        }
        ppVar4->beta = iVar2 + (int)((float)(dag->final_node_ascr << 10) * (float)ascale);
      }
      else {
        plVar6 = ppVar4->to->exits;
        if (plVar6 != (latlink_list_t *)0x0) {
          logb_x = ppVar4->beta;
          do {
            logb_x = logmath_add(lmath,logb_x,
                                 (int)((float)(plVar6->link->ascr << 10) * (float)ascale) +
                                 plVar6->link->beta + iVar2);
            ppVar4->beta = logb_x;
            plVar6 = plVar6->next;
          } while (plVar6 != (latlink_list_s *)0x0);
        }
      }
      ppVar4 = ps_lattice_reverse_next(dag,(ps_latnode_t *)0x0);
    } while (ppVar4 != (ps_latlink_t *)0x0);
  }
  ppVar1 = dag->search;
  if ((ppVar1 == (ps_search_t *)0x0) || (iVar2 = strcmp(ppVar1->type,"ngram"), iVar2 != 0)) {
    model = (ngram_model_t *)0x0;
  }
  else {
    model = (ngram_model_t *)ppVar1[1].vt;
  }
  uVar5 = (uint)((float)(dag->final_node_ascr << 10) * (float)ascale);
  do {
    if (ppVar7 == (ps_latlink_t *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
              ,0x5a3,"Joint P(O,S) = %d P(S|O) = %d\n",(ulong)uVar5,(ulong)(uVar5 - dag->norm));
      return uVar5 - dag->norm;
    }
    if (model != (ngram_model_t *)0x0) {
      local_4c = ppVar7->from->basewid;
      local_48 = (ps_latlink_t *)CONCAT44(local_48._4_4_,ppVar7->to->basewid);
      iVar2 = dict_filler_word(dag->dict,local_4c);
      if (iVar2 == 0) {
        bVar10 = false;
      }
      else {
        bVar10 = ppVar7->from != dag->start;
      }
      iVar2 = dict_filler_word(dag->dict,(s3wid_t)local_48);
      if (iVar2 == 0) {
        bVar11 = false;
      }
      else {
        bVar11 = ppVar7->to != dag->end;
      }
      if ((!bVar11) && (ppVar8 = ppVar7, bVar10)) {
        do {
          ppVar8 = ppVar8->best_prev;
          if (ppVar8 == (ps_latlink_s *)0x0) {
            bVar10 = true;
            goto LAB_00113136;
          }
          local_4c = ppVar8->from->basewid;
          iVar2 = dict_filler_word(dag->dict,local_4c);
          if (iVar2 == 0) {
            bVar10 = false;
            goto LAB_00113136;
          }
        } while (ppVar8->from != dag->start);
        bVar10 = false;
      }
LAB_00113136:
      if (!bVar10 && !bVar11) {
        iVar3 = ngram_ng_prob(model,(s3wid_t)local_48,&local_4c,1,&local_3c);
        uVar5 = uVar5 + iVar3;
      }
    }
    uVar5 = uVar5 + (int)((float)(ppVar7->ascr << 10) * (float)ascale);
    ppVar7 = ppVar7->best_prev;
  } while( true );
}

Assistant:

int32
ps_lattice_posterior(ps_lattice_t *dag, ngram_model_t *lmset,
                     float32 ascale)
{
    logmath_t *lmath;
    ps_latnode_t *node;
    ps_latlink_t *link;
    latlink_list_t *x;
    ps_latlink_t *bestend;
    int32 bestescr;

    lmath = dag->lmath;

    /* Reset all betas to zero. */
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next) {
            x->link->beta = logmath_get_zero(lmath);
        }
    }

    bestend = NULL;
    bestescr = MAX_NEG_INT32;
    /* Accumulate backward probabilities for all links. */
    for (link = ps_lattice_reverse_edges(dag, NULL, NULL);
         link; link = ps_lattice_reverse_next(dag, NULL)) {
        int32 bprob, n_used;
        int32 from_wid, to_wid;
        int16 from_is_fil, to_is_fil;

        from_wid = link->from->basewid;
        to_wid = link->to->basewid;
        from_is_fil = dict_filler_word(dag->dict, from_wid) && link->from != dag->start;
        to_is_fil = dict_filler_word(dag->dict, to_wid) && link->to != dag->end;

        /* Find word predecessor if from-word is filler */
        if (!to_is_fil && from_is_fil) {
            ps_latlink_t *prev_link = link;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                from_wid = prev_link->from->basewid;
                if (!dict_filler_word(dag->dict, from_wid) || prev_link->from == dag->start) {
                    from_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Calculate LM probability. */
        if (lmset && !from_is_fil && !to_is_fil)
            bprob = ngram_ng_prob(lmset, to_wid, &from_wid, 1, &n_used);
        else
            bprob = 0;

        if (link->to == dag->end) {
            /* Track the best path - we will backtrace in order to
               calculate the unscaled joint probability for sentence
               posterior. */
            if (link->path_scr BETTER_THAN bestescr) {
                bestescr = link->path_scr;
                bestend = link;
            }
            /* Imaginary exit link from final node has beta = 1.0 */
            link->beta = bprob + (int32)((dag->final_node_ascr << SENSCR_SHIFT) * ascale);
        }
        else {
            /* Update beta from all outgoing betas. */
            for (x = link->to->exits; x; x = x->next) {
                link->beta = logmath_add(lmath, link->beta,
                                         x->link->beta + bprob
                                         + (int)((x->link->ascr << SENSCR_SHIFT) * ascale));
            }
        }
    }

    /* Return P(S|O) = P(O,S)/P(O) */
    return ps_lattice_joint(dag, bestend, ascale) - dag->norm;
}